

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::do_eof(http *this)

{
  error_code *in_RDI;
  error_code e;
  undefined1 local_18 [24];
  
  if ((in_RDI[0x26].field_0x6 & 1) != 0) {
    booster::aio::basic_io_device::cancel();
  }
  in_RDI[0x26].field_0x6 = 0;
  if (((ulong)in_RDI[0x26]._M_cat & 0x100) == 0) {
    std::error_code::error_code(in_RDI);
    booster::aio::stream_socket::shutdown(in_RDI + 0x10,1,local_18);
    booster::aio::basic_io_device::close(in_RDI + 0x10);
  }
  return;
}

Assistant:

virtual void do_eof()
		{
			if(eof_callback_)
				socket_.cancel();
			eof_callback_ = false;
			if(!keep_alive_) {
				booster::system::error_code e;
				socket_.shutdown(io::stream_socket::shut_wr,e);
				socket_.close(e);
			}
		}